

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTT.hpp
# Opt level: O2

PropertyBase *
Protocol::MQTT::V5::TypedProperty<(Protocol::MQTT::V5::PropertyType)42,_unsigned_char>::allocateProp
          (void)

{
  PropertyBase *pPVar1;
  
  pPVar1 = (PropertyBase *)operator_new(0x38);
  pPVar1->type = '*';
  pPVar1->next = (PropertyBase *)0x0;
  pPVar1->heapAllocated = true;
  pPVar1[1].super_Serializable._vptr_Serializable = (_func_int **)&pPVar1[1].type;
  (pPVar1->super_Serializable)._vptr_Serializable = (_func_int **)&PTR_getSize_00123e48;
  *(undefined ***)&pPVar1[1].type = &PTR_typeSize_00124288;
  *(undefined1 *)&pPVar1[1].next = 0;
  return pPVar1;
}

Assistant:

static PropertyBase * allocateProp() { return new Property<T>(type, T(), true) ; }